

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMini.c
# Opt level: O0

Abc_Obj_t * Abc_NodeFanin1Copy(Abc_Ntk_t *pNtk,Vec_Int_t *vCopies,Mini_Aig_t *p,int Id)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  int AbcLit;
  int Lit;
  int Id_local;
  Mini_Aig_t *p_local;
  Vec_Int_t *vCopies_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Mini_AigNodeFanin1(p,Id);
  iVar2 = Abc_Lit2Var(iVar1);
  iVar2 = Vec_IntEntry(vCopies,iVar2);
  iVar1 = Abc_LitIsCompl(iVar1);
  iVar1 = Abc_LitNotCond(iVar2,iVar1);
  pAVar3 = Abc_ObjFromLit(pNtk,iVar1);
  return pAVar3;
}

Assistant:

Abc_Obj_t * Abc_NodeFanin1Copy( Abc_Ntk_t * pNtk, Vec_Int_t * vCopies, Mini_Aig_t * p, int Id )
{
    int Lit = Mini_AigNodeFanin1( p, Id );
    int AbcLit = Abc_LitNotCond( Vec_IntEntry(vCopies, Abc_Lit2Var(Lit)), Abc_LitIsCompl(Lit) );
    return Abc_ObjFromLit( pNtk, AbcLit );
}